

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_suite.cpp
# Opt level: O1

void __thiscall parser_suite::test_path_plain::test_method(test_path_plain *this)

{
  int iVar1;
  long *local_230 [2];
  long local_220 [2];
  char *local_210;
  string *local_208;
  undefined **local_200;
  undefined1 local_1f8;
  undefined8 *local_1f0;
  char *local_1e8;
  view_type local_1e0;
  undefined8 *local_1d0;
  string **local_1c8;
  undefined **local_1c0;
  undefined1 local_1b8;
  undefined8 *local_1b0;
  char **local_1a8;
  undefined1 local_1a0 [8];
  undefined8 local_198;
  shared_count sStack_190;
  char *local_188;
  char *local_180;
  parser parser;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [26];
  
  local_1e0.ptr_ = input;
  builtin_strncpy(input + 0x10,".com/path",10);
  builtin_strncpy(input,"scheme://example",0x10);
  local_1e0.len_ = strlen(local_1e0.ptr_);
  parser.current_scheme.ptr_ = (char *)0x0;
  parser.current_scheme.len_ = 0;
  parser.current_authority.ptr_ = (char *)0x0;
  parser.current_authority.len_ = 0;
  parser.current_userinfo.ptr_ = (char *)0x0;
  parser.current_userinfo.len_ = 0;
  parser.current_host.ptr_ = (char *)0x0;
  parser.current_host.len_ = 0;
  parser.current_port.ptr_ = (char *)0x0;
  parser.current_port.len_ = 0;
  parser.current_path.ptr_ = (char *)0x0;
  parser.current_path.len_ = 0;
  parser.current_query.ptr_ = (char *)0x0;
  parser.current_query.len_ = 0;
  parser.current_fragment.ptr_ = (char *)0x0;
  parser.current_fragment.len_ = 0;
  trial::url::basic_parser<char>::parse(&parser,&local_1e0);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x52);
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00186260;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = "";
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,parser.current_scheme.ptr_,
             parser.current_scheme.ptr_ + parser.current_scheme.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_230);
  local_1a0[0] = iVar1 == 0;
  local_198 = 0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_180 = "";
  local_1c8 = &local_208;
  local_1e0.len_ = local_1e0.len_ & 0xffffffffffffff00;
  local_1e0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_210;
  local_210 = "scheme";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186358;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_208 = (string *)local_230;
  boost::test_tools::tt_detail::report_assertion
            (local_1a0,&local_200,&local_188,0x52,2,2,2,"parser.scheme()",&local_1e0,"\"scheme\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_190);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x53);
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00186260;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = "";
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,parser.current_authority.ptr_,
             parser.current_authority.ptr_ + parser.current_authority.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_230);
  local_1a0[0] = iVar1 == 0;
  local_198 = 0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_180 = "";
  local_1e0.len_ = local_1e0.len_ & 0xffffffffffffff00;
  local_1e0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_208;
  local_210 = "example.com";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186458;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_210;
  local_208 = (string *)local_230;
  boost::test_tools::tt_detail::report_assertion
            (local_1a0,&local_200,&local_188,0x53,2,2,2,"parser.authority()",&local_1e0,
             "\"example.com\"",&local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_190);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x54);
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00186260;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = "";
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,parser.current_path.ptr_,
             parser.current_path.ptr_ + parser.current_path.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_230);
  local_1a0[0] = iVar1 == 0;
  local_198 = 0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_180 = "";
  local_1e0.len_ = local_1e0.len_ & 0xffffffffffffff00;
  local_1e0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_208;
  local_210 = "/path";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186498;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_210;
  local_208 = (string *)local_230;
  boost::test_tools::tt_detail::report_assertion
            (local_1a0,&local_200,&local_188,0x54,2,2,2,"parser.path()",&local_1e0,"\"/path\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_190);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x55);
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00186260;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = "";
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,parser.current_query.ptr_,
             parser.current_query.ptr_ + parser.current_query.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_230);
  local_1a0[0] = iVar1 == 0;
  local_198 = 0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_180 = "";
  local_1e0.len_ = local_1e0.len_ & 0xffffffffffffff00;
  local_1e0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_208;
  local_210 = "";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186318;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_210;
  local_208 = (string *)local_230;
  boost::test_tools::tt_detail::report_assertion
            (local_1a0,&local_200,&local_188,0x55,2,2,2,"parser.query()",&local_1e0,"\"\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_190);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_e0 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x56);
  local_1f8 = 0;
  local_200 = &PTR__lazy_ostream_00186260;
  local_1f0 = &boost::unit_test::lazy_ostream::inst;
  local_1e8 = "";
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_230,parser.current_fragment.ptr_,
             parser.current_fragment.ptr_ + parser.current_fragment.len_);
  iVar1 = std::__cxx11::string::compare((char *)local_230);
  local_1a0[0] = iVar1 == 0;
  local_198 = 0;
  sStack_190.pi_ = (sp_counted_base *)0x0;
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_180 = "";
  local_1e0.len_ = local_1e0.len_ & 0xffffffffffffff00;
  local_1e0.ptr_ = (char *)&PTR__lazy_ostream_001862d8;
  local_1d0 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_208;
  local_210 = "";
  local_1b8 = 0;
  local_1c0 = &PTR__lazy_ostream_00186318;
  local_1b0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = &local_210;
  local_208 = (string *)local_230;
  boost::test_tools::tt_detail::report_assertion
            (local_1a0,&local_200,&local_188,0x56,2,2,2,"parser.fragment()",&local_1e0,"\"\"",
             &local_1c0);
  boost::detail::shared_count::~shared_count(&sStack_190);
  if (local_230[0] != local_220) {
    operator_delete(local_230[0],local_220[0] + 1);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_plain)
{
    const char input[] = "scheme://example.com/path";
    url::parser parser(input);
    BOOST_REQUIRE_EQUAL(parser.scheme(), "scheme");
    BOOST_REQUIRE_EQUAL(parser.authority(), "example.com");
    BOOST_REQUIRE_EQUAL(parser.path(), "/path");
    BOOST_REQUIRE_EQUAL(parser.query(), "");
    BOOST_REQUIRE_EQUAL(parser.fragment(), "");
}